

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qalloc.h
# Opt level: O0

size_t QtPrivate::fittedAllocSize
                 (size_t headerSize,size_t *capacity,size_t elementSize,size_t unusedCapacity,
                 size_t alignment)

{
  enable_if_t<std::is_unsigned_v<unsigned_long>,_bool> eVar1;
  enable_if_t<std::is_unsigned_v<unsigned_long>____std::is_signed_v<unsigned_long>,_bool> eVar2;
  long lVar3;
  unsigned_long in_RCX;
  ulong in_RDX;
  unsigned_long *in_RSI;
  unsigned_long in_RDI;
  ulong in_R8;
  long in_FS_OFFSET;
  size_t newPayloadSize;
  size_t newTotalCapacity;
  size_t fittedSize;
  size_t allocSize;
  size_t payloadSize;
  size_t totalCapacity;
  size_t local_28;
  unsigned_long local_20;
  unsigned_long local_18;
  unsigned_long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0;
  eVar1 = qAddOverflow<unsigned_long>(*in_RSI,in_RCX,&local_10);
  if (eVar1) {
    local_28 = 0;
  }
  else {
    local_18 = 0;
    eVar2 = qMulOverflow<unsigned_long>(local_10,in_RDX,&local_18);
    if (eVar2) {
      local_28 = 0;
    }
    else {
      local_20 = 0;
      eVar1 = qAddOverflow<unsigned_long>(in_RDI,local_18,&local_20);
      if (eVar1) {
        local_28 = 0;
      }
      else {
        lVar3 = QtPrivate::expectedAllocSize(local_20,in_R8);
        if (lVar3 == 0) {
          local_28 = local_20;
        }
        else {
          *in_RSI = (lVar3 - in_RDI) / in_RDX - in_RCX;
          local_28 = in_RDI + (*in_RSI + in_RCX) * in_RDX;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

inline size_t fittedAllocSize(size_t headerSize, size_t *capacity,
                              size_t elementSize, size_t unusedCapacity, size_t alignment) noexcept
{
    size_t totalCapacity = 0; // = capacity + unusedCapacity
    if (Q_UNLIKELY(qAddOverflow(*capacity, unusedCapacity, &totalCapacity)))
        return 0; // or handle error

    size_t payloadSize = 0; // = totalCapacity * elementSize
    if (Q_UNLIKELY(qMulOverflow(totalCapacity, elementSize, &payloadSize)))
        return 0;

    size_t allocSize = 0; // = headerSize + payloadSize
    if (Q_UNLIKELY(qAddOverflow(headerSize, payloadSize, &allocSize)))
        return 0;

    if (size_t fittedSize = expectedAllocSize(allocSize, alignment); fittedSize != 0) {
        // no need to overflow/underflow check from fittedSize,
        // since allocSize <= fittedSize <= SIZE_T_MAX
        *capacity = (fittedSize - headerSize) / elementSize - unusedCapacity;
        size_t newTotalCapacity = *capacity + unusedCapacity;
        size_t newPayloadSize = newTotalCapacity * elementSize;
        return headerSize + newPayloadSize;
    }

    return allocSize;
}